

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void skewness_double_suite::test_exponential_increase(void)

{
  double dVar1;
  anon_struct_8_1_6167ffdf_for_sum aVar2;
  double dVar3;
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  close_to<double> predicate_27;
  double *in_stack_ffffffffffffff58;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  moment_skewness<double> filter;
  
  filter.super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.mean_factor = 0.125;
  filter.super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.normalization = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.sum.mean = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)2>.var_factor = 0.25;
  filter.super_basic_moment<double,_(trial::online::with)2>.normalization = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance = 0.0;
  filter.skewness_factor = 0.25;
  filter.normalization = 0.0;
  filter.sum.skewness = 0.0;
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,1.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x237,"void skewness_double_suite::test_exponential_increase()",&local_98,&local_a0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 0.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x238,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,predicate
            );
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 0.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x239,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_00);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,10.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 5.8;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x23b,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_01);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 10.08;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","10.08","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x23c,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_02);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.32288;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.32288","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x23d,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_03);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,100.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 41.4734;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","41.4734","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x23f,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_04);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 1486.96;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1486.96","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x240,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_05);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.51234;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.51234","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x241,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_06);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,1000.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 331.01;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","331.01","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x243,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_07);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 164617.0;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","164617.","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x244,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_08);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.64023;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.64023","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x245,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_09);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,10000.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 2812.32;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2812.32","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x247,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_10);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 17044900.0;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.70449e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x248,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_11);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.73071;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.73071","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x249,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_12);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,100000.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 24852.2;
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","24852.2","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x24b,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_13);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 1729330000.0;
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.72933e9","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x24c,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_14);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.79586;
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.79586","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x24d,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_15);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,1000000.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 225565.0;
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","225565.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x24f,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_16);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 174265000000.0;
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.74265e11","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x250,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_17);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.84332;
  predicate_18.absolute = 2.2250738585072014e-308;
  predicate_18.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.84332","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x251,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_18);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,10000000.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 2086960.0;
  predicate_19.absolute = 2.2250738585072014e-308;
  predicate_19.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08696e6","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x253,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_19);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 17521400000000.0;
  predicate_20.absolute = 2.2250738585072014e-308;
  predicate_20.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.75214e13","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x254,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_20);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.87816;
  predicate_21.absolute = 2.2250738585072014e-308;
  predicate_21.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.87816","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x255,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_21);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,100000000.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 19587900.0;
  predicate_22.absolute = 2.2250738585072014e-308;
  predicate_22.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.95879e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x257,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_22);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 1.76054e+15;
  predicate_23.absolute = 2.2250738585072014e-308;
  predicate_23.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.76054e15","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x258,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_23);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.9039;
  predicate_24.absolute = 2.2250738585072014e-308;
  predicate_24.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.9039","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x259,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_24);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,1000000000.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 185889000.0;
  predicate_25.absolute = 2.2250738585072014e-308;
  predicate_25.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.85889e8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x25b,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_25);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 1.76876e+17;
  predicate_26.absolute = 2.2250738585072014e-308;
  predicate_26.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.76876e17","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x25c,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_26);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.92298;
  predicate_27.absolute = 2.2250738585072014e-308;
  predicate_27.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.92298","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x25d,0x10e83e,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_27);
  return;
}

Assistant:

void test_exponential_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_skewness<double> filter(one_over_eight, one_over_four, one_over_four);

    filter.push(1e0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.0, tolerance);
    filter.push(1e1);
    TRIAL_TEST_WITH(filter.mean(), 5.8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 10.08, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.32288, tolerance);
    filter.push(1e2);
    TRIAL_TEST_WITH(filter.mean(), 41.4734, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1486.96, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.51234, tolerance);
    filter.push(1e3);
    TRIAL_TEST_WITH(filter.mean(), 331.01, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 164617., tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.64023, tolerance);
    filter.push(1e4);
    TRIAL_TEST_WITH(filter.mean(), 2812.32, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.70449e7, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.73071, tolerance);
    filter.push(1e5);
    TRIAL_TEST_WITH(filter.mean(), 24852.2, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.72933e9, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.79586, tolerance);
    filter.push(1e6);
    TRIAL_TEST_WITH(filter.mean(), 225565.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.74265e11, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.84332, tolerance);
    filter.push(1e7);
    TRIAL_TEST_WITH(filter.mean(), 2.08696e6, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.75214e13, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.87816, tolerance);
    filter.push(1e8);
    TRIAL_TEST_WITH(filter.mean(), 1.95879e7, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.76054e15, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.9039, tolerance);
    filter.push(1e9);
    TRIAL_TEST_WITH(filter.mean(), 1.85889e8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.76876e17, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.92298, tolerance);
}